

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O3

void __thiscall ON_ModelComponent::ON_ModelComponent(ON_ModelComponent *this,Type component_type)

{
  undefined8 uVar1;
  ON__UINT32 OVar2;
  ON__UINT64 local_20;
  
  ON_Object::ON_Object(&this->super_ON_Object);
  (this->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_00814ff0;
  LOCK();
  UNLOCK();
  local_20 = (long)Internal_RuntimeSerialNumberGenerator.super___atomic_base<unsigned_long>._M_i + 1
  ;
  Internal_RuntimeSerialNumberGenerator.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       (__atomic_base<unsigned_long>)
       (Internal_RuntimeSerialNumberGenerator.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
  this->m_runtime_serial_number = local_20;
  OVar2 = ON_CRC32(0,8,&local_20);
  this->m_content_version_number = local_20 << 0x20 | (ulong)OVar2;
  this->m_model_serial_number = 0;
  this->m_reference_model_serial_number = 0;
  this->m_linked_idef_serial_number = 0;
  this->m_component_type = component_type;
  this->m_locked_status = 0;
  this->m_set_status = 0;
  this->m_component_status = ON_ComponentStatus::NoneSet;
  this->m_reserved2 = 0;
  this->m_component_index = -0x7fffffff;
  this->m_reserved3 = 0;
  (this->m_component_id).Data1 = 0;
  (this->m_component_id).Data2 = 0;
  (this->m_component_id).Data3 = 0;
  (this->m_component_id).Data4[0] = '\0';
  (this->m_component_id).Data4[1] = '\0';
  (this->m_component_id).Data4[2] = '\0';
  (this->m_component_id).Data4[3] = '\0';
  (this->m_component_id).Data4[4] = '\0';
  (this->m_component_id).Data4[5] = '\0';
  (this->m_component_id).Data4[6] = '\0';
  (this->m_component_id).Data4[7] = '\0';
  (this->m_component_parent_id).Data1 = 0;
  (this->m_component_parent_id).Data2 = 0;
  (this->m_component_parent_id).Data3 = 0;
  (this->m_component_parent_id).Data4[0] = '\0';
  (this->m_component_parent_id).Data4[1] = '\0';
  (this->m_component_parent_id).Data4[2] = '\0';
  (this->m_component_parent_id).Data4[3] = '\0';
  (this->m_component_parent_id).Data4[4] = '\0';
  (this->m_component_parent_id).Data4[5] = '\0';
  (this->m_component_parent_id).Data4[6] = '\0';
  (this->m_component_parent_id).Data4[7] = '\0';
  (this->m_component_name_hash).m_flags = 0;
  uVar1 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
  *(undefined8 *)(this->m_component_name_hash).m_sha1_hash.m_digest =
       ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
  *(undefined8 *)((this->m_component_name_hash).m_sha1_hash.m_digest + 8) = uVar1;
  *(undefined4 *)((this->m_component_name_hash).m_sha1_hash.m_digest + 0x10) =
       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  (this->m_component_name_hash).m_parent_id.Data1 = 0;
  (this->m_component_name_hash).m_parent_id.Data2 = 0;
  (this->m_component_name_hash).m_parent_id.Data3 = 0;
  (this->m_component_name_hash).m_parent_id.Data4[0] = '\0';
  (this->m_component_name_hash).m_parent_id.Data4[1] = '\0';
  (this->m_component_name_hash).m_parent_id.Data4[2] = '\0';
  (this->m_component_name_hash).m_parent_id.Data4[3] = '\0';
  (this->m_component_name_hash).m_parent_id.Data4[4] = '\0';
  (this->m_component_name_hash).m_parent_id.Data4[5] = '\0';
  (this->m_component_name_hash).m_parent_id.Data4[6] = '\0';
  (this->m_component_name_hash).m_parent_id.Data4[7] = '\0';
  ON_wString::ON_wString(&this->m_component_name);
  if (this->m_component_type != Unset) {
    this->m_locked_status = 2;
    this->m_set_status = 2;
  }
  return;
}

Assistant:

ON_ModelComponent::ON_ModelComponent(
  ON_ModelComponent::Type component_type
  ) ON_NOEXCEPT
  : m_runtime_serial_number(++ON_ModelComponent::Internal_RuntimeSerialNumberGenerator)
  , m_content_version_number(ON_ModelComponentContentVersionNumberOne(m_runtime_serial_number))
  , m_component_type(component_type)
{
  if (ON_ModelComponent::Type::Unset != m_component_type)
  {
    m_locked_status = ON_ModelComponent::Attributes::TypeAttribute;
    m_set_status = ON_ModelComponent::Attributes::TypeAttribute;
  }
}